

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O1

int RebootSeanet(SEANET *pSeanet)

{
  int iVar1;
  ssize_t sVar2;
  long lVar3;
  long *plVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  char *__s;
  int nbdatabytes;
  uchar reqbuf [14];
  uchar databuf [22];
  CHRONO chrono;
  int local_bc;
  timespec local_b8;
  undefined6 uStack_a8;
  undefined2 local_a2;
  undefined6 uStack_a0;
  uchar local_98 [20];
  byte bStack_84;
  undefined1 uStack_83;
  timespec local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  long local_58;
  long lStack_50;
  timespec local_48;
  int local_38;
  
  uStack_a0 = 0xa0280100302;
  uStack_a8 = 0x83830303040;
  local_a2 = 0xff00;
  local_bc = 0;
  iVar1 = (pSeanet->RS232Port).DevType;
  iVar7 = 1;
  __s = "Error writing data to a Seanet. ";
  if (iVar1 - 1U < 4) {
    iVar1 = (pSeanet->RS232Port).s;
    uVar6 = 0;
    do {
      sVar2 = send(iVar1,(void *)((long)&uStack_a8 + uVar6),(long)(0xe - (int)uVar6),0);
      if ((int)sVar2 < 1) goto LAB_001a2248;
      uVar5 = (int)uVar6 + (int)sVar2;
      uVar6 = (ulong)uVar5;
    } while ((int)uVar5 < 0xe);
  }
  else {
    if (iVar1 != 0) goto LAB_001a2248;
    iVar1 = *(int *)&(pSeanet->RS232Port).hDev;
    uVar6 = 0;
    do {
      sVar2 = write(iVar1,(void *)((long)&uStack_a8 + uVar6),(ulong)(0xe - (int)uVar6));
      if ((int)sVar2 < 1) goto LAB_001a2248;
      uVar5 = (int)uVar6 + (int)sVar2;
      uVar6 = (ulong)uVar5;
    } while (uVar5 < 0xe);
  }
  local_78.tv_sec = 1;
  local_78.tv_nsec = 0;
  nanosleep(&local_78,(timespec *)0x0);
  iVar1 = clock_getres(4,&local_48);
  if ((iVar1 == 0) && (iVar1 = clock_gettime(4,&local_78), iVar1 == 0)) {
    local_38 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    lStack_50 = 0;
  }
  __s = "Error reading data from a Seanet : Reboot timeout. ";
  while( true ) {
    lVar3 = local_58;
    plVar4 = &lStack_50;
    if (local_38 == 0) {
      clock_gettime(4,&local_b8);
      local_b8.tv_sec =
           (local_b8.tv_sec + local_58 + (local_b8.tv_nsec + lStack_50) / 1000000000) -
           local_78.tv_sec;
      local_b8.tv_nsec = (local_b8.tv_nsec + lStack_50) % 1000000000 - local_78.tv_nsec;
      if (local_b8.tv_nsec < 0) {
        local_b8.tv_sec = local_b8.tv_sec + local_b8.tv_nsec / 1000000000 + -1;
        local_b8.tv_nsec = local_b8.tv_nsec % 1000000000 + 1000000000;
      }
      lVar3 = local_b8.tv_sec;
      plVar4 = &local_b8.tv_nsec;
    }
    if (30.0 < (double)*plVar4 / 1000000000.0 + (double)lVar3) break;
    local_98[0] = '\0';
    local_98[1] = '\0';
    local_98[2] = '\0';
    local_98[3] = '\0';
    local_98[4] = '\0';
    local_98[5] = '\0';
    local_98[6] = '\0';
    local_98[7] = '\0';
    local_98[8] = '\0';
    local_98[9] = '\0';
    local_98[10] = '\0';
    local_98[0xb] = '\0';
    local_98[0xc] = '\0';
    local_98[0xd] = '\0';
    local_98[0xe] = '\0';
    local_98[0xf] = '\0';
    local_98[0x10] = '\0';
    local_98[0x11] = '\0';
    local_98[0x12] = '\0';
    local_98[0x13] = '\0';
    bStack_84 = 0;
    uStack_83 = 0;
    local_bc = 0;
    iVar1 = GetLatestMsgSeanet(pSeanet,4,local_98,0x16,&local_bc);
    if (iVar1 != 0) {
      __s = "A Seanet is not responding correctly. ";
      iVar7 = 1;
      goto LAB_001a2248;
    }
    pSeanet->HeadInf = (uint)bStack_84;
    if (-1 < (char)bStack_84 && (bStack_84 & 6) == 2) {
      return 0;
    }
  }
  iVar7 = 2;
LAB_001a2248:
  puts(__s);
  return iVar7;
}

Assistant:

inline int RebootSeanet(SEANET* pSeanet)
{
	unsigned char reqbuf[] = {MESSAGE_HEADER_SEANET,'0','0','0','8',0x08,0x00,
		SERIAL_PORT_PROGRAM_NODE_NUMBER_SEANET,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,
		0x03,mtReboot,0x80,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,MESSAGE_TERMINATOR_SEANET};
	unsigned char databuf[22];
	int nbdatabytes = 0;
	CHRONO chrono;

	// Send mtReboot message.
	if (WriteAllRS232Port(&pSeanet->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Seanet. \n");
		return EXIT_FAILURE;
	}

	mSleep(1000); // Wait for the device to reboot.

	StartChrono(&chrono);

	// Check mtAlive message HeadInf byte with Transducer Centred (bit 1=1), not Motoring (bit 2=0), not SentCfg (bit 7=0).
	do
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_REBOOT_SEANET)
		{
			printf("Error reading data from a Seanet : Reboot timeout. \n");
			return EXIT_TIMEOUT;
		}

		// Wait for a mtAlive message. It should come every 1 second.
		memset(databuf, 0, sizeof(databuf));
		nbdatabytes = 0;
		if (GetLatestMsgSeanet(pSeanet, mtAlive, databuf, sizeof(databuf), &nbdatabytes)
			!= EXIT_SUCCESS)
		{ 
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}

		// HeadInf.
		pSeanet->HeadInf = (unsigned char)databuf[20];

		//printf("mtAlive message databuf[20]=%#x\n", (int)databuf[20]);
	}
	while (!(databuf[20]&0x02)||(databuf[20]&0x04)||(databuf[20]&0x80));

	return EXIT_SUCCESS;
}